

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
::Simplex_boundary_enumerator::next
          (optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,Simplex_boundary_enumerator *this)

{
  byte bVar1;
  uint uVar2;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
  *this_00;
  int iVar3;
  simplex_t sVar4;
  bool bVar5;
  vertex_t vVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  char cVar10;
  simplex_t index;
  value_t diameter;
  diameter_entry_t dVar11;
  
  if (this->k < '\0') {
    bVar5 = false;
  }
  else {
    vVar6 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::get_max_vertex
                      (this->simplex_encoding,this->idx_below,this->k + '\x01',this->j);
    this->j = vVar6;
    lVar7 = 1;
    lVar9 = lVar7;
    if (this->k != -1) {
      lVar9 = (long)vVar6 << (this->k * (char)this->simplex_encoding->bits_per_vertex & 0x3fU);
    }
    index = (this->idx_above - lVar9) + this->idx_below;
    diameter = compute_diameter(this->parent,index,this->dim + -1);
    this_00 = this->parent;
    uVar2 = this_00->modulus;
    bVar1 = this->k;
    iVar8 = 1;
    if ((bVar1 & 1) != 0) {
      iVar8 = uVar2 - 1;
    }
    iVar3 = this_00->bits_for_coeff;
    sVar4 = (this->simplex).
            super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
            .second.content;
    lVar9 = lVar7;
    if (bVar1 != 0xff) {
      lVar9 = (long)this->j << ((char)this->simplex_encoding->bits_per_vertex * bVar1 & 0x3f);
    }
    this->idx_below = this->idx_below - lVar9;
    if (bVar1 == 0) {
      cVar10 = -1;
    }
    else {
      cVar10 = bVar1 - 1;
      lVar7 = (long)this->j << (cVar10 * (char)this->simplex_encoding->bits_per_vertex & 0x3fU);
    }
    this->idx_above = this->idx_above + lVar7;
    this->k = cVar10;
    dVar11 = make_diameter_entry(this_00,diameter,index,
                                 (((~(uint)(-1L << ((byte)iVar3 & 0x3f)) & (uint)sVar4) + 1) * iVar8
                                 ) % uVar2);
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
    ._M_payload._M_value.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
    .first = dVar11.
             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
             .first;
    *(simplex_t *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
             )._M_payload.
             super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
             ._M_payload + 8) =
         dVar11.
         super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
         .second.content.content;
    bVar5 = true;
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
  ._M_engaged = bVar5;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next() {
        if (!has_next()) return std::nullopt;
        j = simplex_encoding.get_max_vertex(idx_below, k + 1, j);

        simplex_t face_index = idx_above - simplex_encoding(j, k + 1) + idx_below;

        // It would make sense to extract the vertices once in set_simplex
        // and pass the proper subset to compute_diameter, but even in cases
        // where this dominates it does not seem to help (probably because we
        // stop at the first coface).
        value_t face_diameter = parent.compute_diameter(face_index, dim - 1);

        const coefficient_t modulus = parent.modulus;
        coefficient_t face_coefficient =
          (k & 1 ? -1 + modulus : 1) * parent.get_coefficient(simplex) % modulus;

        idx_below -= simplex_encoding(j, k + 1);
        idx_above += simplex_encoding(j, k);

        --k;

        return parent.make_diameter_entry(face_diameter, face_index, face_coefficient);
      }